

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toms917.cpp
# Opt level: O3

int wrightomega_ext(complex<double> z,complex<double> *w,complex<double> *e,complex<double> *r,
                   complex<double> *cond)

{
  bool bVar1;
  bool bVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  double *pdVar5;
  complex<double> *__z;
  complex<double> *pcVar6;
  undefined4 in_XMM0_Da;
  undefined4 uVar7;
  undefined4 in_XMM0_Db;
  undefined4 uVar8;
  double in_XMM1_Qa;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double local_128;
  double local_120;
  double local_118;
  double local_110;
  double local_108;
  double local_100;
  double local_f8;
  complex<double> *local_f0;
  double local_e8;
  double dStack_e0;
  double local_d8;
  double dStack_d0;
  double local_c8;
  double dStack_b8;
  complex<double> z_local;
  double local_78;
  undefined4 local_68;
  double dStack_48;
  complex<double> __r;
  
  pdVar5 = z._M_value._8_8_;
  __z = z._M_value._0_8_;
  local_c8 = (double)CONCAT44(in_XMM0_Db,in_XMM0_Da);
  dStack_b8 = (double)CONCAT44(in_XMM0_Db,in_XMM0_Da);
  local_d8 = 0.0;
  dStack_d0 = 0.0;
  local_e8 = 0.0;
  dStack_e0 = 0.0;
  if ((NAN(local_c8)) || (NAN(in_XMM1_Qa))) {
    *(undefined8 *)__z->_M_value = 0x7ff8000000000000;
    *(undefined8 *)(__z->_M_value + 8) = 0x7ff8000000000000;
  }
  else if ((((3.141592653589793 < in_XMM1_Qa) || (in_XMM1_Qa <= -3.141592653589793)) ||
           (0.0 <= local_c8)) || (ABS(local_c8) != INFINITY)) {
    if ((ABS(local_c8) == INFINITY) || (ABS(in_XMM1_Qa) == INFINITY)) {
      *(double *)__z->_M_value = local_c8;
      *(double *)(__z->_M_value + 8) = in_XMM1_Qa;
    }
    else {
      dVar9 = ABS(in_XMM1_Qa);
      if (((local_c8 != -1.0) || (NAN(local_c8))) || ((dVar9 != 3.141592653589793 || (NAN(dVar9)))))
      {
        dVar13 = in_XMM1_Qa + -3.141592653589793;
        dVar11 = in_XMM1_Qa + 3.141592653589793;
        bVar2 = local_c8 <= 1.0;
        bVar1 = -2.0 < local_c8;
        local_f0 = e;
        z_local._M_value._0_8_ = in_XMM1_Qa;
        if (((!bVar1 || !bVar2) || (in_XMM1_Qa <= 1.0)) || (6.283185307179586 <= in_XMM1_Qa)) {
          if (((!bVar1 || !bVar2) || (in_XMM1_Qa <= -6.283185307179586)) || (-1.0 <= in_XMM1_Qa)) {
            if (((3.141592653589793 < in_XMM1_Qa) || (-2.0 < local_c8)) ||
               (in_XMM1_Qa <= -3.141592653589793)) {
              if ((!(bool)(~(bVar1 && bVar2) & 1U | 1.0 < dVar9)) ||
                 ((-2.0 < local_c8 &&
                  ((local_c8 + -1.0) * (local_c8 + -1.0) + in_XMM1_Qa * in_XMM1_Qa <=
                   9.869604401089358)))) {
                local_d8 = local_c8 + -1.0;
                dVar9 = local_c8 * 0.5;
                dStack_48 = local_d8 * 0.00021158854166666667 + -0.0003255208333333333;
                __r._M_value._0_8_ = in_XMM1_Qa * 0.00021158854166666667;
                dStack_d0 = in_XMM1_Qa;
                std::complex<double>::operator*=
                          ((complex<double> *)&dStack_48,(complex<double> *)&local_d8);
                dStack_48 = dStack_48 + -0.005208333333333333;
                std::complex<double>::operator*=
                          ((complex<double> *)&dStack_48,(complex<double> *)&local_d8);
                dStack_48 = dStack_48 + 0.0625;
                std::complex<double>::operator*=
                          ((complex<double> *)&dStack_48,(complex<double> *)&local_d8);
                std::complex<double>::operator*=
                          ((complex<double> *)&dStack_48,(complex<double> *)&local_d8);
                dVar9 = dVar9 + 0.5 + dStack_48;
                local_78 = in_XMM1_Qa * 0.5 + (double)__r._M_value._0_8_;
              }
              else {
                if ((((local_c8 <= -1.05) && (3.141592653589793 < in_XMM1_Qa)) &&
                    (dVar9 = dVar13, dVar13 <= (local_c8 + 1.0) * -0.75)) ||
                   (((local_c8 <= -1.05 && ((local_c8 + 1.0) * 0.75 < dVar11)) &&
                    (dVar9 = dVar11, dVar11 <= 0.0)))) {
                  dVar10 = -dVar9;
                  local_e8 = local_c8;
                  dStack_e0 = dVar9;
                  local_d8 = clog(-(double)CONCAT44(in_XMM0_Db,in_XMM0_Da));
                  dStack_48 = local_d8 * 0.3333333333333333 + -1.5;
                  __r._M_value._0_8_ = dVar10 * 0.3333333333333333;
                  dStack_d0 = dVar10;
                  std::complex<double>::operator*=
                            ((complex<double> *)&dStack_48,(complex<double> *)&local_d8);
                  dStack_48 = dStack_48 + 1.0;
                  std::complex<double>::operator*=
                            ((complex<double> *)&dStack_48,(complex<double> *)&local_d8);
                  uVar3 = __r._M_value._0_8_;
                  dVar9 = dStack_48;
                  __r._M_value._0_8_ = dStack_d0 * 0.5;
                  dStack_48 = local_d8 * 0.5 + -1.0;
                  std::complex<double>::operator*=
                            ((complex<double> *)&dStack_48,(complex<double> *)&local_d8);
                  dVar10 = dStack_48;
                  z_local._M_value._8_8_ = __r._M_value._0_8_;
                  dStack_48 = local_e8 - local_d8;
                  __r._M_value._0_8_ = dStack_e0 - dStack_d0;
                  std::complex<double>::operator*=
                            ((complex<double> *)&dStack_48,(complex<double> *)&local_e8);
                  dStack_48 = dStack_48 + local_d8;
                  __r._M_value._0_8_ = (double)__r._M_value._0_8_ + dStack_d0;
                  pcVar6 = (complex<double> *)&local_e8;
                  std::complex<double>::operator*=((complex<double> *)&dStack_48,pcVar6);
                  dStack_48 = dVar10 + dStack_48;
                  __r._M_value._0_8_ = (double)z_local._M_value._8_8_ + (double)__r._M_value._0_8_;
                  std::complex<double>::operator*=((complex<double> *)&dStack_48,pcVar6);
                  local_68 = SUB84(dVar9 + dStack_48,0);
                  local_78 = (double)uVar3 + (double)__r._M_value._0_8_;
                  uVar7 = local_e8._0_4_;
                  uVar8 = local_e8._4_4_;
                  __r._M_value._0_4_ = dStack_e0._0_4_;
                  __r._M_value._4_4_ = dStack_e0._4_4_;
                }
                else {
                  z_local._M_value._8_8_ = in_XMM1_Qa;
                  local_d8 = clog((double)CONCAT44(in_XMM0_Db,in_XMM0_Da));
                  dStack_48 = local_d8 * 0.3333333333333333 + -1.5;
                  __r._M_value._0_8_ = in_XMM1_Qa * 0.3333333333333333;
                  dStack_d0 = in_XMM1_Qa;
                  std::complex<double>::operator*=
                            ((complex<double> *)&dStack_48,(complex<double> *)&local_d8);
                  dStack_48 = dStack_48 + 1.0;
                  std::complex<double>::operator*=
                            ((complex<double> *)&dStack_48,(complex<double> *)&local_d8);
                  uVar3 = __r._M_value._0_8_;
                  dVar9 = dStack_48;
                  __r._M_value._0_8_ = dStack_d0 * 0.5;
                  dStack_48 = local_d8 * 0.5 + -1.0;
                  std::complex<double>::operator*=
                            ((complex<double> *)&dStack_48,(complex<double> *)&local_d8);
                  uVar4 = __r._M_value._0_8_;
                  local_f8 = dStack_48;
                  dStack_48 = local_c8 - local_d8;
                  __r._M_value._0_8_ = (double)z_local._M_value._8_8_ - dStack_d0;
                  std::complex<double>::operator*=
                            ((complex<double> *)&dStack_48,(complex<double> *)&dStack_b8);
                  dStack_48 = dStack_48 + local_d8;
                  __r._M_value._0_8_ = (double)__r._M_value._0_8_ + dStack_d0;
                  pcVar6 = (complex<double> *)&dStack_b8;
                  std::complex<double>::operator*=((complex<double> *)&dStack_48,pcVar6);
                  dStack_48 = local_f8 + dStack_48;
                  __r._M_value._0_8_ = (double)uVar4 + (double)__r._M_value._0_8_;
                  std::complex<double>::operator*=((complex<double> *)&dStack_48,pcVar6);
                  local_68 = SUB84(dVar9 + dStack_48,0);
                  local_78 = (double)uVar3 + (double)__r._M_value._0_8_;
                  uVar7 = dStack_b8._0_4_;
                  uVar8 = dStack_b8._4_4_;
                  __r._M_value._0_4_ = z_local._M_value._0_4_;
                  __r._M_value._4_4_ = z_local._M_value._4_4_;
                }
                dStack_48 = (double)CONCAT44(uVar8,uVar7);
                std::complex<double>::operator*=((complex<double> *)&dStack_48,pcVar6);
                std::complex<double>::operator*=((complex<double> *)&dStack_48,pcVar6);
                dVar9 = (double)__divdc3(local_68,local_78,dStack_48,__r._M_value._0_8_);
              }
            }
            else {
              local_d8 = cexp((double)CONCAT44(in_XMM0_Db,in_XMM0_Da));
              dStack_48 = local_d8 * 5.208333333333333 + -2.6666666666666665;
              __r._M_value._0_8_ = in_XMM1_Qa * 5.208333333333333;
              dStack_d0 = in_XMM1_Qa;
              std::complex<double>::operator*=
                        ((complex<double> *)&dStack_48,(complex<double> *)&local_d8);
              dStack_48 = dStack_48 + 1.5;
              std::complex<double>::operator*=
                        ((complex<double> *)&dStack_48,(complex<double> *)&local_d8);
              dStack_48 = dStack_48 + -1.0;
              std::complex<double>::operator*=
                        ((complex<double> *)&dStack_48,(complex<double> *)&local_d8);
              dStack_48 = dStack_48 + 1.0;
              std::complex<double>::operator*=
                        ((complex<double> *)&dStack_48,(complex<double> *)&local_d8);
              local_78 = (double)__r._M_value._0_8_;
              dVar9 = dStack_48;
            }
          }
          else {
            dVar9 = dVar11 * -2.0;
            local_d8 = csqrt(local_c8 + 1.0 + local_c8 + 1.0);
            dStack_d0 = -dVar9;
            dStack_48 = 0.0;
            __r._M_value._0_8_ = 0x3f2e573ac901e574;
            std::complex<double>::operator*=
                      ((complex<double> *)&dStack_48,(complex<double> *)&local_d8);
            dStack_48 = 0.003703703703703704 - dStack_48;
            __r._M_value._0_8_ = __r._M_value._0_8_ ^ 0x8000000000000000;
            std::complex<double>::operator*=
                      ((complex<double> *)&dStack_48,(complex<double> *)&local_d8);
            dStack_48 = dStack_48 + 0.0;
            __r._M_value._0_8_ = (double)__r._M_value._0_8_ + 0.027777777777777776;
            std::complex<double>::operator*=
                      ((complex<double> *)&dStack_48,(complex<double> *)&local_d8);
            dStack_48 = dStack_48 + 0.3333333333333333;
            std::complex<double>::operator*=
                      ((complex<double> *)&dStack_48,(complex<double> *)&local_d8);
            __r._M_value._0_8_ = (double)__r._M_value._0_8_ + -1.0;
            std::complex<double>::operator*=
                      ((complex<double> *)&dStack_48,(complex<double> *)&local_d8);
            local_78 = (double)__r._M_value._0_8_;
            dVar9 = dStack_48 + -1.0;
          }
        }
        else {
          dVar9 = (double)CONCAT44(in_XMM0_Db,in_XMM0_Da) + 1.0;
          dVar10 = dVar13 * -2.0;
          local_d8 = csqrt(dVar9 + dVar9);
          dStack_d0 = -dVar10;
          dStack_48 = 0.0;
          __r._M_value._0_8_ = 0x3f2e573ac901e574;
          std::complex<double>::operator*=
                    ((complex<double> *)&dStack_48,(complex<double> *)&local_d8);
          dStack_48 = dStack_48 + 0.003703703703703704;
          std::complex<double>::operator*=
                    ((complex<double> *)&dStack_48,(complex<double> *)&local_d8);
          __r._M_value._0_8_ = (double)__r._M_value._0_8_ + -0.027777777777777776;
          std::complex<double>::operator*=
                    ((complex<double> *)&dStack_48,(complex<double> *)&local_d8);
          dStack_48 = dStack_48 + 0.3333333333333333;
          std::complex<double>::operator*=
                    ((complex<double> *)&dStack_48,(complex<double> *)&local_d8);
          dStack_48 = dStack_48 + 0.0;
          __r._M_value._0_8_ = (double)__r._M_value._0_8_ + 1.0;
          std::complex<double>::operator*=
                    ((complex<double> *)&dStack_48,(complex<double> *)&local_d8);
          local_78 = (double)__r._M_value._0_8_;
          dVar9 = dStack_48 + -1.0;
        }
        *(double *)__z->_M_value = dVar9;
        *(double *)(__z->_M_value + 8) = local_78;
        dVar9 = 1.0;
        if ((local_c8 <= -0.99) && ((ABS(dVar13) <= 0.01 || (dVar9 = 1.0, ABS(dVar11) <= 0.01)))) {
          fesetround(0x800);
          if (0.01 < ABS(dVar13)) {
            dVar13 = dVar11;
          }
          if (dVar13 <= 0.0) {
            fesetround(0x400);
          }
          dStack_b8 = local_c8;
          z_local._M_value._0_8_ = dVar13;
          fesetround(0);
          dVar9 = -1.0;
        }
        dVar13 = *(double *)__z->_M_value * dVar9;
        dVar10 = *(double *)(__z->_M_value + 8) * dVar9;
        *(double *)__z->_M_value = dVar13;
        *(double *)(__z->_M_value + 8) = dVar10;
        dVar12 = dStack_b8 - dVar9 * dVar13;
        dVar11 = (double)z_local._M_value._0_8_ - dVar9 * dVar10;
        local_c8 = dVar9;
        dVar9 = clog(dVar13);
        dVar12 = dVar12 - dVar9;
        dVar11 = dVar11 - dVar10;
        *(double *)w->_M_value = dVar12;
        *(double *)(w->_M_value + 8) = dVar11;
        dVar10 = *(double *)(__z->_M_value + 8) * local_c8;
        dVar13 = *(double *)__z->_M_value * local_c8 + 1.0;
        z_local._M_value._8_8_ = __divdc3(SUB84(dVar12,0));
        local_128 = *(double *)w->_M_value * 0.6666666666666666 + dVar13;
        local_120 = *(double *)(w->_M_value + 8) * 0.6666666666666666 + dVar10;
        dStack_48 = dVar13 + dVar13;
        __r._M_value._0_8_ = dVar10 + dVar10;
        std::complex<double>::operator*=
                  ((complex<double> *)&dStack_48,(complex<double> *)&local_128);
        local_108 = dStack_48 - *(double *)w->_M_value;
        local_100 = (double)__r._M_value._0_8_ - *(double *)(w->_M_value + 8);
        dStack_48 = (double)z_local._M_value._8_8_;
        __r._M_value._0_8_ = dVar11;
        std::complex<double>::operator*=
                  ((complex<double> *)&dStack_48,(complex<double> *)&local_108);
        dVar9 = (double)__r._M_value._0_8_;
        z_local._M_value._8_8_ = dStack_48;
        local_118 = *(double *)w->_M_value * 0.6666666666666666 + dVar13;
        local_110 = *(double *)(w->_M_value + 8) * 0.6666666666666666 + dVar10;
        dStack_48 = dVar13 + dVar13;
        __r._M_value._0_8_ = dVar10 + dVar10;
        std::complex<double>::operator*=
                  ((complex<double> *)&dStack_48,(complex<double> *)&local_118);
        local_108 = (double)__divdc3(z_local._M_value._8_4_,dVar9,
                                     dStack_48 - (*(double *)w->_M_value + *(double *)w->_M_value),
                                     (double)__r._M_value._0_8_ -
                                     (*(double *)(w->_M_value + 8) + *(double *)(w->_M_value + 8)));
        *pdVar5 = local_108;
        pdVar5[1] = dVar9;
        local_108 = local_108 + 1.0;
        dStack_48 = *(double *)__z->_M_value;
        __r._M_value._0_8_ = *(undefined8 *)(__z->_M_value + 8);
        local_100 = dVar9;
        std::complex<double>::operator*=
                  ((complex<double> *)&dStack_48,(complex<double> *)&local_108);
        *(double *)__z->_M_value = dStack_48;
        *(undefined8 *)(__z->_M_value + 8) = __r._M_value._0_8_;
        dStack_48 = dStack_48 + dStack_48;
        __r._M_value._0_8_ = (double)__r._M_value._0_8_ + (double)__r._M_value._0_8_;
        std::complex<double>::operator*=((complex<double> *)&dStack_48,__z);
        dVar11 = dStack_48 - *(double *)__z->_M_value * 8.0;
        dVar9 = cabs(*(double *)w->_M_value);
        dVar9 = pow(dVar9,4.0);
        dVar11 = cabs((dVar11 + -1.0) * dVar9);
        dVar9 = cabs(dVar13);
        dVar10 = pow(dVar9,6.0);
        dVar9 = *(double *)__z->_M_value;
        dVar13 = *(double *)(__z->_M_value + 8);
        if (dVar10 * 1.5987211554602254e-14 <= dVar11) {
          dVar10 = dStack_b8 - local_c8 * dVar9;
          dVar11 = (double)z_local._M_value._0_8_ - local_c8 * dVar13;
          dVar9 = clog(dVar9);
          dVar10 = dVar10 - dVar9;
          dVar11 = dVar11 - dVar13;
          *(double *)w->_M_value = dVar10;
          *(double *)(w->_M_value + 8) = dVar11;
          dVar12 = *(double *)(__z->_M_value + 8) * local_c8;
          dVar13 = *(double *)__z->_M_value * local_c8 + 1.0;
          z_local._M_value._8_8_ = __divdc3(SUB84(dVar10,0));
          local_128 = *(double *)w->_M_value * 0.6666666666666666 + dVar13;
          local_120 = *(double *)(w->_M_value + 8) * 0.6666666666666666 + dVar12;
          dStack_48 = dVar13 + dVar13;
          __r._M_value._0_8_ = dVar12 + dVar12;
          std::complex<double>::operator*=
                    ((complex<double> *)&dStack_48,(complex<double> *)&local_128);
          local_108 = dStack_48 - *(double *)w->_M_value;
          local_100 = (double)__r._M_value._0_8_ - *(double *)(w->_M_value + 8);
          dStack_48 = (double)z_local._M_value._8_8_;
          __r._M_value._0_8_ = dVar11;
          std::complex<double>::operator*=
                    ((complex<double> *)&dStack_48,(complex<double> *)&local_108);
          dVar9 = (double)__r._M_value._0_8_;
          z_local._M_value._8_8_ = dStack_48;
          local_118 = *(double *)w->_M_value * 0.6666666666666666 + dVar13;
          local_110 = *(double *)(w->_M_value + 8) * 0.6666666666666666 + dVar12;
          dStack_48 = dVar13 + dVar13;
          __r._M_value._0_8_ = dVar12 + dVar12;
          std::complex<double>::operator*=
                    ((complex<double> *)&dStack_48,(complex<double> *)&local_118);
          local_108 = (double)__divdc3(z_local._M_value._8_4_,dVar9,
                                       dStack_48 - (*(double *)w->_M_value + *(double *)w->_M_value)
                                       ,(double)__r._M_value._0_8_ -
                                        (*(double *)(w->_M_value + 8) + *(double *)(w->_M_value + 8)
                                        ));
          *pdVar5 = local_108;
          pdVar5[1] = dVar9;
          local_108 = local_108 + 1.0;
          dStack_48 = *(double *)__z->_M_value;
          __r._M_value._0_8_ = *(undefined8 *)(__z->_M_value + 8);
          local_100 = dVar9;
          std::complex<double>::operator*=
                    ((complex<double> *)&dStack_48,(complex<double> *)&local_108);
          dVar9 = dStack_48;
          dVar13 = (double)__r._M_value._0_8_;
        }
        pcVar6 = local_f0;
        *(double *)__z->_M_value = dVar9 * local_c8;
        *(double *)(__z->_M_value + 8) = dVar13 * local_c8;
        uVar3 = __divdc3(SUB84(dStack_b8,0),z_local._M_value._0_8_,dVar9 * local_c8 + 1.0);
        *(undefined8 *)pcVar6->_M_value = uVar3;
        *(undefined8 *)(pcVar6->_M_value + 8) = z_local._M_value._0_8_;
        return 0;
      }
      *(undefined8 *)__z->_M_value = 0xbff0000000000000;
      *(undefined8 *)(__z->_M_value + 8) = 0;
    }
  }
  else {
    *(undefined8 *)__z->_M_value = 0;
    *(undefined8 *)(__z->_M_value + 8) = 0;
  }
  *pdVar5 = 0.0;
  pdVar5[1] = 0.0;
  *(undefined8 *)w->_M_value = 0;
  *(undefined8 *)(w->_M_value + 8) = 0;
  return 0;
}

Assistant:

int wrightomega_ext ( std::complex <double> z, std::complex <double> &w, 
  std::complex <double> &e, std::complex <double> &r, std::complex <double> &cond )

//****************************************************************************80
//
//  Purpose:
//
//    WRIGHTOMEGA_EXT computes the Wright Omega function with extra information.
//
//  Discussion:
//
//    WRIGHTOMEGA_EXT is the extended routine for evaluating the Wright
//    Omega function with the option of extracting the last update step,
//    the penultimate residual and the condition number estimate.
//
//  Modified:
//
//    14 May 2016
//
//  Author:
//
//    Piers Lawrence, Robert Corless, David Jeffrey
//
//  Reference:
//
//    Piers Lawrence, Robert Corless, David Jeffrey,
//    Algorithm 917: Complex Double-Precision Evaluation of the Wright Omega 
//    Function,
//    ACM Transactions on Mathematical Software,
//    Volume 38, Number 3, Article 20, April 2012, 17 pages.
//
//  Parameters:
//
//    Input, complex <double> Z, value at which to evaluate Wrightomega().
//
//    Output, complex <double> &W, the value of Wrightomega(z).
//
//    Output, complex <double> &E, the last update step in the iterative scheme.
//
//    Output, complex <double> &R, the penultimate residual,
//    r_k = z - w_k - log(w_k)
//
//    Output, complex <double> &COND, the condition number estimate. 
//
//    Output, int WRIGHTOMEGA_EXT, error flag;
//    0, successful computation.
//    nonzero, the computation failed.        
//
{
  double near;
  double pi = 3.1415926535897932384626433832795029;//M_PI;
  std::complex <double> pz;
  double s = 1.0;
  std::complex <double> t;
  std::complex <double> wp1;
  double x;
  double y;
  double ympi;
  double yppi;
// 
//  Extract real and imaginary parts of Z. 
//
  x = std::real ( z );
  y = std::imag ( z );
// 
//  Compute if we are near the branch cuts.
//
  ympi = y - pi;
  yppi = y + pi;
  near = 0.01;
// 
//  Test for floating point exceptions:
//

//
//  NaN output for NaN input.
//
  if ( std::isnan ( x ) || std::isnan ( y ) )
  {
    w = std::complex <double> ( ( 0.0 / 0.0 ), ( 0.0 / 0.0 ) );
    e = std::complex <double> ( 0.0, 0.0 );
    r = std::complex <double> ( 0.0, 0.0 );
    return 0;
  }
//
//  Signed zeros between branches.
//
  else if ( std::isinf ( x ) && ( x < 0.0 ) && ( - pi < y ) && ( y <= pi ) )
  {
    if ( fabs ( y ) <= pi / 2.0 )
    {
      w = + 0.0;
    }
    else
    {
      w = - 0.0;
    }
      
    if ( 0.0 <= y )
    {
      w = w + std::complex <double> ( 0.0, 0.0 );
    }
    else
    {
      w = w + std::complex <double> ( 0.0, - 1.0 * 0.0 );
    }

    e = std::complex <double> ( 0.0, 0.0 );
    r = std::complex <double> ( 0.0, 0.0 );
    return 0;
  }
//
//  Asymptotic for large z.
//
  else if ( std::isinf ( x ) || std::isinf ( y ) )
  {
    w = std::complex <double> ( x, y );
    e = std::complex <double> ( 0.0, 0.0 );
    r = std::complex <double> ( 0.0, 0.0 );
    return 0;
  }
//
//  Test if exactly on the singular points.
//
  if ( ( x == - 1.0 ) && ( fabs ( y ) == pi ) )
  {
    w = std::complex <double> ( - 1.0, 0.0 );
    e = std::complex <double> ( 0.0, 0.0 );
    r = std::complex <double> ( 0.0, 0.0 );
    return 0;
  }
// 
//  Choose approximation based on region.
//

//
//  Region 1: upper branch point.
//  Series about z=-1+Pi*I.
//
  if ( ( - 2.0 < x && x <= 1.0 && 1.0 < y && y < 2.0 * pi ) )
  {
    pz = conj ( sqrt ( conj ( 2.0 * ( z + std::complex <double> ( 1.0, - pi ) ) ) ) );

    w = - 1.0 
      + ( std::complex <double> ( 0.0, 1.0 )
      + ( 1.0 / 3.0 
      + ( - 1.0 / 36.0 * std::complex <double> ( 0.0, 1.0 ) 
      + ( 1.0 / 270.0 + 1.0 / 4320.0 * std::complex <double> ( 0.0, 1.0 ) * pz ) 
      * pz ) * pz ) * pz ) * pz;
  }
//
//  Region 2: lower branch point.
//  Series about z=-1-Pi*I.
//
  else if ( ( - 2.0 < x && x <= 1.0 && - 2.0 * pi < y && y <- 1.0 ) )
  {
    pz = conj ( sqrt ( conj ( 2.0 * ( z + 1.0 + std::complex <double> ( 0.0, pi ) ) ) ) );

    w = - 1.0 
      + ( - std::complex <double> ( 0.0, 1.0 ) + ( 1.0 / 3.0 
      + ( 1.0 / 36.0 * std::complex <double> ( 0.0, 1.0 )
      + ( 1.0 / 270.0 - 1.0 / 4320.0 * std::complex <double> ( 0.0, 1.0 ) * pz ) 
      * pz ) * pz ) * pz ) * pz;
  }
//
//  Region 3: between branch cuts.
//  Series: About -infinity.
//
  else if ( x <= - 2.0 && - pi < y && y <= pi )
  {
    pz = exp ( z );
    w = ( 1.0 
      + ( - 1.0 
      + ( 3.0 / 2.0 
      + ( - 8.0 / 3.0 
      + 125.0 / 24.0 * pz ) * pz ) * pz ) * pz ) * pz;
  }
//
//  Region 4: Mushroom.
//  Series about z=1.
//
  else if ( ( ( - 2.0 < x ) && ( x <= 1.0 ) && ( - 1.0 <= y ) && ( y <= 1.0 ) )
    || ( ( - 2.0 < x ) && ( x - 1.0 ) * ( x - 1.0 ) + y * y <= pi * pi ) )
  {
    pz = z - 1.0;
    w = 1.0 / 2.0 + 1.0 / 2.0 * z 
      + ( 1.0 / 16.0 
      + ( - 1.0 / 192.0 
      + ( - 1.0 / 3072.0 + 13.0 / 61440.0 * pz ) * pz ) * pz ) * pz * pz;
  }
//
//  Region 5: Top wing.
//  Negative log series.
//
  else if ( x <= - 1.05 && pi < y && y - pi <= - 0.75 * ( x + 1.0 ) )
  {
    t = z - std::complex <double> ( 0.0, pi );
    pz = log ( - t );
    w = ( ( 1.0 + ( - 3.0 / 2.0 + 1.0 / 3.0 * pz ) * pz ) * pz 
      + ( ( -1.0 + 1.0 / 2.0 * pz ) * pz + ( pz + ( - pz + t ) * t ) * t ) * t ) 
      / ( t * t * t );
  }
//
//  Region 6: Bottom wing.
//  Negative log series.
//
  else if ( x <= - 1.05 && 0.75 * ( x + 1.0 ) < y + pi && y + pi <= 0.0 )
  {
    t = z + std::complex <double> ( 0.0, pi );
    pz = log ( - t );
    w = ( ( 1.0 + ( - 3.0 / 2.0 + 1.0 / 3.0 * pz ) * pz ) * pz
      + ( ( - 1.0 + 1.0 / 2.0 * pz ) * pz + ( pz + ( - pz + t ) * t ) * t ) * t ) 
      / ( t * t * t );
  }
//
//  Region 7: Everywhere else.
//  Series solution about infinity.
//
  else
  {
    pz = log ( z );
    w = ( ( 1.0 + ( - 3.0 / 2.0 + 1.0 / 3.0 * pz ) * pz ) * pz 
      + ( ( - 1.0 + 1.0 / 2.0 * pz ) * pz + ( pz + ( - pz + z ) * z ) * z ) * z ) 
      / ( z * z * z );
  }
//
//  Regularize if near branch cuts.
///
  if ( x <= - 1.0 + near && ( fabs ( ympi ) <= near || fabs ( yppi ) <= near ) ) 
  { 
    s = - 1.0;
    if ( fabs ( ympi ) <= near )
    {
//
//  Recompute ympi with directed rounding.
//
      fesetround ( FE_UPWARD );
      ympi = y - pi;
          
      if ( ympi <= 0.0 )
      {
        fesetround ( FE_DOWNWARD );
        ympi = y - pi;
      }
         
      z = std::complex <double> ( x, ympi ); 
// 
//  Return rounding to default.
//
      fesetround ( FE_TONEAREST );
    }
    else
    {
//
//  Recompute yppi with directed rounding.
//
      fesetround ( FE_UPWARD );
      yppi = y + pi;
          
      if ( yppi <= 0.0 )
      {
        fesetround ( FE_DOWNWARD );
        yppi = y + pi;
      }

      z = std::complex <double> ( x, yppi );
// 
//  Return rounding to default.
//
      fesetround ( FE_TONEAREST );
    }
  }
//
//  Iteration one.
//
  w = s * w;
  r = z - s * w - log ( w );
  wp1 = s * w + 1.0;
  e = r / wp1 * ( 2.0 * wp1 * ( wp1 + 2.0 / 3.0 * r ) - r )
    / ( 2.0 * wp1 * ( wp1 + 2.0 / 3.0 * r ) - 2.0 * r );
  w = w * ( 1.0 + e );
//
//  Iteration two.
//
  if ( abs ( ( 2.0 * w * w - 8.0 * w - 1.0 ) * pow ( abs ( r ), 4.0 ) ) 
    >= TWOITERTOL * 72.0 * pow ( abs ( wp1 ), 6.0 ) )
  {
    r = z - s * w - log ( w );
    wp1 = s * w + 1.0;
    e = r / wp1 * ( 2.0 * wp1 * ( wp1 + 2.0 / 3.0 * r ) - r ) 
      / ( 2.0 * wp1 * ( wp1 + 2.0 / 3.0 * r ) - 2.0 * r );
    w = w * ( 1.0 + e );
  }
//
//  Undo regularization.
//
  w = s * w;
//
//  Provide condition number estimate.
//
  cond = z / ( 1.0 + w );
      
  return 0;
}